

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int selectExpander(Walker *pWalker,Select *p)

{
  i16 iVar1;
  uint uVar2;
  Parse *pParse_00;
  sqlite3 *db_00;
  SrcList *pList;
  ExprList *pList_00;
  bool bVar3;
  int iVar4;
  Db *pDVar5;
  char *pcVar6;
  Table *pTable;
  Select *pSVar7;
  Expr *pEVar8;
  char *local_128;
  bool local_119;
  ExprList_item *pX;
  Expr *pLeft;
  Token sColname;
  char *zToFree;
  char *zColname;
  char *zName;
  char *pcStack_d8;
  int iDb;
  char *zSchemaName;
  char *zTabName;
  Select *pSub;
  Table *pTab_1;
  char *zTName;
  int tableSeen;
  int longNames;
  int flags;
  ExprList *pNew;
  ExprList_item *a;
  Select *pSStack_88;
  i16 nCol;
  Select *pSel;
  Table *pTab;
  Expr *pEStack_70;
  u16 selFlags;
  Expr *pExpr;
  Expr *pRight;
  Expr *pE;
  sqlite3 *db;
  SrcList_item *pFrom;
  ExprList *pEList;
  SrcList *pTabList;
  int local_30;
  int k;
  int j;
  int i;
  Parse *pParse;
  Select *p_local;
  Walker *pWalker_local;
  
  pParse_00 = pWalker->pParse;
  db_00 = pParse_00->db;
  uVar2 = p->selFlags;
  p->selFlags = p->selFlags | 0x40;
  if (db_00->mallocFailed == '\0') {
    if ((p->pSrc == (SrcList *)0x0) || ((uVar2 & 0x40) != 0)) {
      pWalker_local._4_4_ = 1;
    }
    else {
      pList = p->pSrc;
      pList_00 = p->pEList;
      if (p->pWith != (With *)0x0) {
        sqlite3WithPush(pParse_00,p->pWith,'\0');
      }
      sqlite3SrcListAssignCursors(pParse_00,pList);
      db = (sqlite3 *)pList->a;
      for (k = 0; k < pList->nSrc; k = k + 1) {
        if ((*(byte *)((long)&db->szMmap + 5) >> 5 & 1) == 0) {
          iVar4 = withExpand(pWalker,(SrcList_item *)db);
          if (iVar4 != 0) {
            return 2;
          }
          if (db->aDb == (Db *)0x0) {
            if (db->pDfltColl == (CollSeq *)0x0) {
              pSStack_88 = *(Select **)&db->nDb;
              iVar4 = sqlite3WalkSelect(pWalker,pSStack_88);
              if (iVar4 != 0) {
                return 2;
              }
              pDVar5 = (Db *)sqlite3DbMallocZero(db_00,0x80);
              db->aDb = pDVar5;
              if (pDVar5 == (Db *)0x0) {
                return 2;
              }
              *(undefined4 *)((long)&pDVar5[1].pSchema + 4) = 1;
              pcVar6 = sqlite3MPrintf(db_00,"sqlite_sq_%p",pDVar5);
              pDVar5->zDbSName = pcVar6;
              for (; pSStack_88->pPrior != (Select *)0x0; pSStack_88 = pSStack_88->pPrior) {
              }
              sqlite3ColumnsFromExprList
                        (pParse_00,pSStack_88->pEList,(i16 *)((long)&pDVar5[2].zDbSName + 6),
                         (Column **)&pDVar5->pBt);
              *(undefined2 *)((long)&pDVar5[2].zDbSName + 4) = 0xffff;
              *(undefined2 *)&pDVar5[2].pBt = 200;
              *(uint *)&pDVar5[2].zDbSName = *(uint *)&pDVar5[2].zDbSName | 2;
            }
            else {
              pTable = sqlite3LocateTableItem(pParse_00,0,(SrcList_item *)db);
              db->aDb = (Db *)pTable;
              if (pTable == (Table *)0x0) {
                return 2;
              }
              if (0xfffe < pTable->nTabRef) {
                sqlite3ErrorMsg(pParse_00,"too many references to \"%s\": max 65535",pTable->zName);
                db->aDb = (Db *)0x0;
                return 2;
              }
              pTable->nTabRef = pTable->nTabRef + 1;
              if ((pTable->nModuleArg == 0) &&
                 (iVar4 = cannotBeFunction(pParse_00,(SrcList_item *)db), iVar4 != 0)) {
                return 2;
              }
              if ((pTable->nModuleArg != 0) || (pTable->pSelect != (Select *)0x0)) {
                iVar4 = sqlite3ViewGetColumnNames(pParse_00,pTable);
                if (iVar4 != 0) {
                  return 2;
                }
                pSVar7 = sqlite3SelectDup(db_00,pTable->pSelect,0);
                *(Select **)&db->nDb = pSVar7;
                iVar1 = pTable->nCol;
                pTable->nCol = -1;
                sqlite3WalkSelect(pWalker,*(Select **)&db->nDb);
                pTable->nCol = iVar1;
              }
            }
          }
          iVar4 = sqlite3IndexedByLookup(pParse_00,(SrcList_item *)db);
          if (iVar4 != 0) {
            return 2;
          }
        }
        db = (sqlite3 *)db->aLimit;
      }
      if ((db_00->mallocFailed == '\0') && (iVar4 = sqliteProcessJoin(pParse_00,p), iVar4 == 0)) {
        pTabList._4_4_ = 0;
        while (((pTabList._4_4_ < pList_00->nExpr &&
                (pEVar8 = pList_00->a[pTabList._4_4_].pExpr, pEVar8->op != 0xa1)) &&
               ((pEVar8->op != 'z' || (pEVar8->pRight->op != 0xa1))))) {
          pTabList._4_4_ = pTabList._4_4_ + 1;
        }
        if (pTabList._4_4_ < pList_00->nExpr) {
          _longNames = (ExprList *)0x0;
          uVar2 = pParse_00->db->flags;
          local_119 = (uVar2 & 4) != 0 && (uVar2 & 0x40) == 0;
          for (pTabList._4_4_ = 0; pTabList._4_4_ < pList_00->nExpr;
              pTabList._4_4_ = pTabList._4_4_ + 1) {
            pEVar8 = pList_00->a[pTabList._4_4_].pExpr;
            if ((pEVar8->op == 0xa1) || ((pEVar8->op == 'z' && (pEVar8->pRight->op == 0xa1)))) {
              bVar3 = false;
              pTab_1 = (Table *)0x0;
              if (pEVar8->op == 'z') {
                pTab_1 = (Table *)(pEVar8->pLeft->u).zToken;
              }
              db = (sqlite3 *)pList->a;
              for (k = 0; k < pList->nSrc; k = k + 1) {
                pDVar5 = db->aDb;
                zTabName = *(char **)&db->nDb;
                zSchemaName = (char *)db->mutex;
                pcStack_d8 = (char *)0x0;
                if ((sqlite3_mutex *)zSchemaName == (sqlite3_mutex *)0x0) {
                  zSchemaName = pDVar5->zDbSName;
                }
                if (db_00->mallocFailed != '\0') break;
                if ((zTabName == (char *)0x0) || ((*(uint *)(zTabName + 0xc) & 0x800) == 0)) {
                  zTabName = (char *)0x0;
                  if ((pTab_1 == (Table *)0x0) ||
                     (iVar4 = sqlite3StrICmp((char *)pTab_1,zSchemaName), iVar4 == 0)) {
                    iVar4 = sqlite3SchemaToIndex(db_00,*(Schema **)&pDVar5[3].safety_level);
                    if (iVar4 < 0) {
                      local_128 = "*";
                    }
                    else {
                      local_128 = db_00->aDb[iVar4].zDbSName;
                    }
                    pcStack_d8 = local_128;
                    goto LAB_0018e889;
                  }
                }
                else {
LAB_0018e889:
                  for (local_30 = 0; local_30 < *(short *)((long)&pDVar5[2].zDbSName + 6);
                      local_30 = local_30 + 1) {
                    zToFree = (char *)(&pDVar5->pBt->db)[(long)local_30 * 4];
                    if (((((pTab_1 == (Table *)0x0) || (zTabName == (char *)0x0)) ||
                         (iVar4 = sqlite3MatchSpanName
                                            (*(char **)(*(long *)zTabName + (long)local_30 * 0x20 +
                                                       0x18),(char *)0x0,(char *)pTab_1,(char *)0x0)
                         , iVar4 != 0)) &&
                        (((p->selFlags & 0x20000) != 0 ||
                         ((*(byte *)((long)&pDVar5->pBt->nBackup + (long)local_30 * 0x20 + 3) & 2)
                          == 0)))) &&
                       (((bVar3 = true, k < 1 || (pTab_1 != (Table *)0x0)) ||
                        ((((db->szMmap & 0x400000000) == 0 ||
                          (iVar4 = tableAndColumnIndex(pList,k,zToFree,(int *)0x0,(int *)0x0),
                          iVar4 == 0)) &&
                         (iVar4 = sqlite3IdListIndex(*(IdList **)&db->dbOptFlags,zToFree), iVar4 < 0
                         )))))) {
                      pEStack_70 = sqlite3Expr(db_00,0x1b,zToFree);
                      sColname.n = 0;
                      sColname._12_4_ = 0;
                      if ((local_119) || (1 < pList->nSrc)) {
                        pEVar8 = sqlite3Expr(db_00,0x1b,zSchemaName);
                        pEStack_70 = sqlite3PExpr(pParse_00,0x7a,pEVar8,pEStack_70);
                        if (pcStack_d8 != (char *)0x0) {
                          pEVar8 = sqlite3Expr(db_00,0x1b,pcStack_d8);
                          pEStack_70 = sqlite3PExpr(pParse_00,0x7a,pEVar8,pEStack_70);
                        }
                        if (local_119) {
                          sColname._8_8_ = sqlite3MPrintf(db_00,"%s.%s",zSchemaName);
                          zToFree = (char *)sColname._8_8_;
                        }
                      }
                      _longNames = sqlite3ExprListAppend(pParse_00,_longNames,pEStack_70);
                      sqlite3TokenInit((Token *)&pLeft,zToFree);
                      sqlite3ExprListSetName(pParse_00,_longNames,(Token *)&pLeft,0);
                      if ((_longNames != (ExprList *)0x0) && ((p->selFlags & 0x800) != 0)) {
                        iVar4 = _longNames->nExpr + -1;
                        if (zTabName == (char *)0x0) {
                          pcVar6 = sqlite3MPrintf(db_00,"%s.%s.%s",pcStack_d8,zSchemaName,zToFree);
                          _longNames->a[iVar4].zSpan = pcVar6;
                        }
                        else {
                          pcVar6 = sqlite3DbStrDup(db_00,*(char **)(*(long *)zTabName +
                                                                    (long)local_30 * 0x20 + 0x18));
                          _longNames->a[iVar4].zSpan = pcVar6;
                        }
                        _longNames->a[iVar4].field_0x19 = _longNames->a[iVar4].field_0x19 & 0xfd | 2
                        ;
                      }
                      sqlite3DbFree(db_00,(void *)sColname._8_8_);
                    }
                  }
                }
                db = (sqlite3 *)db->aLimit;
              }
              if (!bVar3) {
                if (pTab_1 == (Table *)0x0) {
                  sqlite3ErrorMsg(pParse_00,"no tables specified");
                }
                else {
                  sqlite3ErrorMsg(pParse_00,"no such table: %s",pTab_1);
                }
              }
            }
            else {
              _longNames = sqlite3ExprListAppend
                                     (pParse_00,_longNames,pList_00->a[pTabList._4_4_].pExpr);
              if (_longNames != (ExprList *)0x0) {
                _longNames->a[_longNames->nExpr + -1].zName = pList_00->a[pTabList._4_4_].zName;
                _longNames->a[_longNames->nExpr + -1].zSpan = pList_00->a[pTabList._4_4_].zSpan;
                pList_00->a[pTabList._4_4_].zName = (char *)0x0;
                pList_00->a[pTabList._4_4_].zSpan = (char *)0x0;
              }
              pList_00->a[pTabList._4_4_].pExpr = (Expr *)0x0;
            }
          }
          sqlite3ExprListDelete(db_00,pList_00);
          p->pEList = _longNames;
        }
        if ((p->pEList == (ExprList *)0x0) || (p->pEList->nExpr <= db_00->aLimit[2])) {
          pWalker_local._4_4_ = 0;
        }
        else {
          sqlite3ErrorMsg(pParse_00,"too many columns in result set");
          pWalker_local._4_4_ = 2;
        }
      }
      else {
        pWalker_local._4_4_ = 2;
      }
    }
  }
  else {
    pWalker_local._4_4_ = 2;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  if( NEVER(p->pSrc==0) || (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  if( p->pWith ){
    sqlite3WithPush(pParse, p->pWith, 0);
  }

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
      if( pTab==0 ) return WRC_Abort;
      pTab->nTabRef = 1;
      pTab->zName = sqlite3MPrintf(db, "sqlite_sq_%p", (void*)pTab);
      while( pSel->pPrior ){ pSel = pSel->pPrior; }
      sqlite3ColumnsFromExprList(pParse, pSel->pEList,&pTab->nCol,&pTab->aCol);
      pTab->iPKey = -1;
      pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
      pTab->tabFlags |= TF_Ephemeral;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        sqlite3SelectSetName(pFrom->pSelect, pTab->zName);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
#if SQLITE_MAX_COLUMN
  if( p->pEList && p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns in result set");
    return WRC_Abort;
  }
#endif
  return WRC_Continue;
}